

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OfType OVar2;
  ostream *os;
  pointer pcVar3;
  pointer pMVar4;
  size_type sVar5;
  bool bVar6;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar7;
  size_t sVar8;
  char *pcVar9;
  XmlWriter *this_00;
  MessageInfo *msg;
  pointer pMVar10;
  string elementName;
  ReusableStringStream rss;
  ScopedElement e;
  char local_c9;
  Column local_c8;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  ReusableStringStream local_50;
  
  OVar2 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar2 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  pcVar9 = "failure";
  if (OVar2 < Exception) {
    if (1 < (uint)(OVar2 + ~FailureBit)) {
      if ((OVar2 != Unknown) && (OVar2 != FailureBit)) goto LAB_0019c624;
LAB_0019c5ec:
      pcVar9 = "internalError";
    }
  }
  else {
    if (OVar2 < DidntThrowException) {
      if (OVar2 == Exception) goto LAB_0019c5ec;
      if (OVar2 != ThrewException) goto LAB_0019c624;
    }
    else {
      if (OVar2 == DidntThrowException) goto LAB_0019c616;
      if (OVar2 != FatalErrorCondition) goto LAB_0019c624;
    }
    pcVar9 = "error";
  }
LAB_0019c616:
  std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar9);
LAB_0019c624:
  this_00 = &this->xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_70);
  paVar1 = &local_c8.m_string.field_2;
  local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"message","");
  AssertionResult::getExpression_abi_cxx11_(&local_90,&stats->assertionResult);
  XmlWriter::writeAttribute(this_00,&local_c8.m_string,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"type","");
  local_90._M_dataplus._M_p = (stats->assertionResult).m_info.macroName.m_start;
  local_90._M_string_length = (stats->assertionResult).m_info.macroName.m_size;
  XmlWriter::writeAttribute<Catch::StringRef>(this_00,&local_c8.m_string,(StringRef *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  pSVar7 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar8 = StringStreams::add(&pSVar7->super_StringStreams);
  local_50.m_index = sVar8;
  pSVar7 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os = (ostream *)
       (pSVar7->super_StringStreams).m_streams.
       super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[sVar8].m_ptr;
  local_50.m_oss = os;
  if ((stats->totals).assertions.failed + (stats->totals).assertions.passed +
      (stats->totals).assertions.failedButOk == 0) {
    local_c8.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c8,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>(os,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_(&local_c8.m_string,&stats->assertionResult);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_c8.m_string._M_dataplus._M_p,local_c8.m_string._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.m_string._M_dataplus._M_p,
                        local_c8.m_string.field_2._M_allocated_capacity + 1);
      }
      local_c8.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c8,1);
    }
    bVar6 = AssertionResult::hasExpandedExpression(&stats->assertionResult);
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_90,&stats->assertionResult);
      local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      local_c8.m_width = 0x4f;
      local_c8.m_initialIndent = 0xffffffffffffffff;
      local_c8.m_indent = 2;
      TextFlow::operator<<(os,&local_c8);
      local_c9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_c9,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_string._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8.m_string._M_dataplus._M_p,
                        local_c8.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pcVar3 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar3,
             pcVar3 + (stats->assertionResult).m_resultData.message._M_string_length);
  sVar5 = local_c8.m_string._M_string_length;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  if (sVar5 != 0) {
    pcVar3 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar3,
               pcVar3 + (stats->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_c8.m_string._M_dataplus._M_p,local_c8.m_string._M_string_length);
    local_90._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_90,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.m_string._M_dataplus._M_p != paVar1) {
      operator_delete(local_c8.m_string._M_dataplus._M_p,
                      local_c8.m_string.field_2._M_allocated_capacity + 1);
    }
  }
  pMVar10 = (stats->infoMessages).
            super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar4 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar10 != pMVar4) {
    do {
      if (pMVar10->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(pMVar10->message)._M_dataplus._M_p,(pMVar10->message)._M_string_length);
        local_c8.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_c8,1);
      }
      pMVar10 = pMVar10 + 1;
    } while (pMVar10 != pMVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"at ",3);
  local_c8.m_string._M_dataplus._M_p = (stats->assertionResult).m_info.lineInfo.file;
  local_c8.m_string._M_string_length = (stats->assertionResult).m_info.lineInfo.line;
  operator<<(os,(SourceLineInfo *)&local_c8);
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(this_00,&local_c8.m_string,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.m_string._M_dataplus._M_p != &local_c8.m_string.field_2) {
    operator_delete(local_c8.m_string._M_dataplus._M_p,
                    local_c8.m_string.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_50);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

bool AssertionResult::isOk() const {
        return Catch::isOk(m_resultData.resultType) || shouldSuppressFailure(m_info.resultDisposition);
    }